

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_UsePuzzleItem(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                    int arg4)

{
  bool bVar1;
  int iVar2;
  AInventory *this;
  FSoundID local_2c;
  
  this = (AInventory *)it;
  iVar2 = 0;
  if (it != (AActor *)0x0) {
    do {
      this = GC::ReadBarrier<AInventory>((AInventory **)&(this->super_AActor).Inventory);
      if (this == (AInventory *)0x0) goto LAB_0040f0a3;
      bVar1 = DObject::IsKindOf((DObject *)this,APuzzleItem::RegistrationInfo.MyClass);
    } while ((!bVar1) || (*(int *)&this->field_0x4fc != arg0));
    iVar2 = (*(it->super_DThinker).super_DObject._vptr_DObject[0x17])(it,this);
    if ((char)iVar2 == '\0') {
LAB_0040f0a3:
      local_2c.ID = S_FindSound("*puzzfail");
      S_Sound(it,2,&local_2c,1.0,1.001);
      iVar2 = 0;
    }
    else {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

FUNC(LS_UsePuzzleItem)
// UsePuzzleItem (item, script)
{
	AInventory *item;

	if (!it) return false;

	// Check player's inventory for puzzle item
	for (item = it->Inventory; item != NULL; item = item->Inventory)
	{
		if (item->IsKindOf (RUNTIME_CLASS(APuzzleItem)))
		{
			if (static_cast<APuzzleItem*>(item)->PuzzleItemNumber == arg0)
			{
				if (it->UseInventory (item))
				{
					return true;
				}
				break;
			}
		}
	}

	// [RH] Say "hmm" if you don't have the puzzle item
	S_Sound (it, CHAN_VOICE, "*puzzfail", 1, ATTN_IDLE);
	return false;
}